

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

vector<Omega_h::any,_std::allocator<Omega_h::any>_> *
Omega_h::any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>&>(any *operand)

{
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *pvVar1;
  bad_any_cast *this;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *p;
  any *operand_local;
  
  pvVar1 = any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>(operand);
  if (pvVar1 == (vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  return pvVar1;
}

Assistant:

inline ValueType any_cast(any& operand) {
  auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
  if (p == nullptr) throw bad_any_cast();
  return *p;
}